

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall
tcu::Matrix<tcu::Interval,_4,_3>::Matrix
          (Matrix<tcu::Interval,_4,_3> *this,Matrix<tcu::Interval,_4,_3> *src)

{
  Vector<tcu::Vector<tcu::Interval,_4>,_3>::Vector(&this->m_data);
  operator=(this,src);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const Matrix<T, Rows, Cols>& src)
{
	*this = src;
}